

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O3

void __thiscall CUI::RenderPopupMenus(CUI *this)

{
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  bool bVar4;
  char cVar5;
  ulong uVar6;
  ulong uVar7;
  CUIRect *this_00;
  long in_FS_OFFSET;
  bool bVar8;
  CUIRect PopupRect;
  vec4 local_58;
  CUIRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = this->m_MouseButtons;
  bVar8 = (uVar1 & 3) != 0;
  if (RenderPopupMenus()::s_MousePressed == '\0') {
    RenderPopupMenus((CUI *)(ulong)bVar8);
  }
  if (this->m_NumPopupMenus != 0) {
    this_00 = &this->m_aPopupMenus[0].m_Rect;
    uVar7 = 0;
    do {
      bVar4 = CUIRect::Inside(this_00,this->m_MouseX,this->m_MouseY);
      uVar6 = (ulong)(this->m_NumPopupMenus - 1);
      if (uVar7 == uVar6) {
        this->m_pBecommingHotItem = this_00;
      }
      local_48.x = this_00->x;
      local_48.y = this_00->y;
      local_48.w = this_00->w;
      local_48.h = this_00->h;
      local_58.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f000000;
      local_58.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f000000;
      local_58.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f000000;
      local_58.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f400000;
      CUIRect::Draw(&local_48,&local_58,3.0,(int)this_00[1].x);
      CUIRect::Margin(&local_48,1.0,&local_48);
      local_58.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x0;
      local_58.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x0;
      local_58.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x0;
      local_58.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f400000;
      CUIRect::Draw(&local_48,&local_58,3.0,(int)this_00[1].x);
      CUIRect::Margin(&local_48,4.0,&local_48);
      uVar3._0_4_ = this_00[1].w;
      uVar3._4_4_ = this_00[1].h;
      cVar5 = (**(code **)(this_00 + 2))(local_48.x,local_48._8_8_,uVar3);
      if (cVar5 == '\0') {
        if (*(char *)&this_00[2].w == '\x01') {
          *(undefined1 *)&this_00[2].w = 0;
        }
        else if ((uVar7 == uVar6) &&
                ((((!bVar4 && ((uVar1 & 3) == 0)) && (RenderPopupMenus::s_MousePressed != false)) ||
                 (uVar2 = this->m_HotkeysPressed, this->m_HotkeysPressed = uVar2 & 0xfffffffd,
                 (uVar2 & 2) != 0)))) {
          this->m_NumPopupMenus = this->m_NumPopupMenus - 1;
        }
      }
      else {
        this->m_NumPopupMenus = (uint)uVar7;
      }
      uVar7 = uVar7 + 1;
      this_00 = this_00 + 3;
    } while (uVar7 < this->m_NumPopupMenus);
  }
  RenderPopupMenus::s_MousePressed = bVar8;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CUI::RenderPopupMenus()
{
	const bool MousePressed = MouseButton(0) || MouseButton(1);
	static bool s_MousePressed = MousePressed;

	for(unsigned i = 0; i < m_NumPopupMenus; i++)
	{
		const bool Inside = MouseInside(&m_aPopupMenus[i].m_Rect);
		const bool Active = i == m_NumPopupMenus - 1;

		// prevent activation of UI elements outside of active popup
		if(Active)
			SetHotItem(&m_aPopupMenus[i]);

		CUIRect PopupRect = m_aPopupMenus[i].m_Rect;
		PopupRect.Draw(vec4(0.5f, 0.5f, 0.5f, 0.75f), 3.0f, m_aPopupMenus[i].m_Corners);
		PopupRect.Margin(1.0f, &PopupRect);
		PopupRect.Draw(vec4(0.0f, 0.0f, 0.0f, 0.75f), 3.0f, m_aPopupMenus[i].m_Corners);
		PopupRect.Margin(4.0f, &PopupRect);

		if(m_aPopupMenus[i].m_pfnFunc(m_aPopupMenus[i].m_pContext, PopupRect))
			m_NumPopupMenus = i; // close this popup and all above it
		else if(m_aPopupMenus[i].m_New)
			m_aPopupMenus[i].m_New = false; // prevent popup from being closed by the click that opens it
		else if(Active && ((!Inside && s_MousePressed && !MousePressed) || ConsumeHotkey(HOTKEY_ESCAPE)))
			m_NumPopupMenus--; // close top-most popup by clicking outside and with escape
	}

	s_MousePressed = MousePressed;
}